

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitSelect(WasmBytecodeGenerator *this)

{
  OpCodeAsmJs OVar1;
  RegSlot RVar2;
  uint uVar3;
  uint uVar4;
  EmitInfo EVar5;
  EmitInfo EVar6;
  EmitInfo EVar7;
  ulong uVar8;
  WasmRegisterSpace *this_00;
  ulong uVar9;
  EmitInfo local_60;
  EmitInfo falseInfo;
  EmitInfo trueInfo;
  EmitInfo conditionInfo;
  
  EVar5 = PopEvalStack(this,FirstLocalType,L"select condition must have i32 type");
  trueInfo = EVar5;
  EVar6 = PopEvalStack(this,Any,(char16 *)0x0);
  local_60 = EVar6;
  EVar7 = PopEvalStack(this,EVar6.type,L"select operands must both have same type");
  falseInfo = EVar7;
  ReleaseLocation(this,&trueInfo);
  ReleaseLocation(this,&local_60);
  ReleaseLocation(this,&falseInfo);
  uVar9 = (ulong)EVar7 >> 0x20;
  if (this->isUnreachable == true) {
    if (uVar9 == 8) {
      uVar9 = (ulong)EVar6 >> 0x20;
    }
    uVar8 = 0xffffffff;
  }
  else {
    this_00 = GetRegisterSpace(this,EVar7.type);
    RVar2 = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
    uVar3 = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
    uVar4 = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
    OVar1 = GetLoadOp(this,EVar7.type);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1a])(this->m_writer,0x27,(ulong)uVar3,EVar5);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
              (this->m_writer,(ulong)OVar1,(ulong)RVar2,(ulong)EVar7 & 0xffffffff);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])(this->m_writer,(ulong)uVar4,0x25);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)uVar3);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
              (this->m_writer,(ulong)OVar1,(ulong)RVar2,EVar6);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)uVar4);
    uVar8 = (ulong)RVar2;
  }
  return (EmitInfo)(uVar9 << 0x20 | uVar8);
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitSelect()
{
    EmitInfo conditionInfo = PopEvalStack(WasmTypes::I32, _u("select condition must have i32 type"));
    EmitInfo falseInfo = PopValuePolymorphic();
    EmitInfo trueInfo = PopEvalStack(falseInfo.type, _u("select operands must both have same type"));
    ReleaseLocation(&conditionInfo);
    ReleaseLocation(&falseInfo);
    ReleaseLocation(&trueInfo);

    if (IsUnreachable())
    {
        if (trueInfo.type == WasmTypes::Any)
        {
            // Report the type of falseInfo for type checking
            return EmitInfo(falseInfo.type);
        }
        // Otherwise report the type of trueInfo for type checking
        return EmitInfo(trueInfo.type);
    }
    WasmTypes::WasmType selectType = trueInfo.type;
    EmitInfo resultInfo = EmitInfo(GetRegisterSpace(selectType)->AcquireTmpRegister(), selectType);

    Js::ByteCodeLabel falseLabel = m_writer->DefineLabel();
    Js::ByteCodeLabel doneLabel = m_writer->DefineLabel();
    Js::OpCodeAsmJs loadOp = GetLoadOp(resultInfo.type);


    // var result;
    // if (!condition) goto:condFalse
    // result = trueRes;
    // goto:done;
    //:condFalse
    // result = falseRes;
    //:done
    m_writer->AsmBrReg1(Js::OpCodeAsmJs::BrFalse_Int, falseLabel, conditionInfo.location);
    m_writer->AsmReg2(loadOp, resultInfo.location, trueInfo.location);
    m_writer->AsmBr(doneLabel);
    m_writer->MarkAsmJsLabel(falseLabel);
    m_writer->AsmReg2(loadOp, resultInfo.location, falseInfo.location);
    m_writer->MarkAsmJsLabel(doneLabel);

    return resultInfo;
}